

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvhsah.hpp
# Opt level: O2

bool BVH::opaqueHit(treenode *node,Ray ray,Hit *h)

{
  vec2f *uv;
  BSDF *pBVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Transparency *this;
  vec3f local_40;
  
  iVar4 = (**node->shape->_vptr_Primitive)(node->shape,&ray,h);
  if ((char)iVar4 == '\0') {
    bVar3 = false;
  }
  else {
    pBVar1 = node->object->bsdf;
    bVar3 = true;
    if (pBVar1 != (BSDF *)0x0) {
      this = (Transparency *)__dynamic_cast(pBVar1,&BSDF::typeinfo,&Transparency::typeinfo,0);
      if (this != (Transparency *)0x0) {
        uv = &h->uv;
        bVar2 = Transparency::isTransparent(this,uv);
        if (bVar2) {
          do {
            local_40 = operator*(0.01,&ray.dir);
            ray.origin = operator+(&h->p,&local_40);
            iVar4 = (**node->shape->_vptr_Primitive)(node->shape,&ray,h);
            if ((char)iVar4 == '\0') break;
            bVar3 = Transparency::isTransparent(this,uv);
          } while (bVar3);
          bVar3 = Transparency::isTransparent(this,uv);
          bVar3 = !bVar3;
        }
      }
    }
  }
  return bVar3;
}

Assistant:

static inline bool opaqueHit(treenode* node, Ray ray, Primitive::Hit* h)
	{
		if (node->shape->intersect(ray, h))
		{
			Transparency* bsdf = dynamic_cast<Transparency*>(node->object->bsdf);
			if (bsdf == NULL || !bsdf->isTransparent(h->uv))
				return true;
			do {
				ray.origin = h->p + 1e-2 * ray.dir;
			}
			while (node->shape->intersect(ray, h) && bsdf->isTransparent(h->uv));
			return !bsdf->isTransparent(h->uv);
		}
		return false;
	}